

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O3

void __thiscall
xLearn::ReaderTest_SampleFromMemory_Test::TestBody(ReaderTest_SampleFromMemory_Test *this)

{
  string ffm_no_file;
  string lr_no_file;
  string csv_file_comma;
  string ffm_file_comma;
  string ffm_no_file_comma;
  string lr_no_file_comma;
  string lr_file_comma;
  string csv_file;
  string ffm_file;
  string lr_file;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  WriteFile();
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,kTestfilename_abi_cxx11_,DAT_001605e8 + kTestfilename_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_50);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,kTestfilename_abi_cxx11_,DAT_001605e8 + kTestfilename_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_70);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,kTestfilename_abi_cxx11_,DAT_001605e8 + kTestfilename_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_90);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,kTestfilename_abi_cxx11_,DAT_001605e8 + kTestfilename_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_b0);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,kTestfilename_abi_cxx11_,DAT_001605e8 + kTestfilename_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_110);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,kTestfilename_abi_cxx11_,DAT_001605e8 + kTestfilename_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_130);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,kTestfilename_abi_cxx11_,DAT_001605e8 + kTestfilename_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_150);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,kTestfilename_abi_cxx11_,DAT_001605e8 + kTestfilename_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_170);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,kTestfilename_abi_cxx11_,DAT_001605e8 + kTestfilename_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_d0);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,kTestfilename_abi_cxx11_,DAT_001605e8 + kTestfilename_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_f0);
  read_from_memory(&local_50,0);
  read_from_memory(&local_70,1);
  read_from_memory(&local_90,2);
  read_from_memory(&local_150,3);
  read_from_memory(&local_170,4);
  read_from_memory(&local_b0,0);
  read_from_memory(&local_110,1);
  read_from_memory(&local_130,2);
  read_from_memory(&local_d0,3);
  read_from_memory(&local_f0,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(ReaderTest, SampleFromMemory) {
  WriteFile();
  // has label
  string lr_file = kTestfilename + "_LR.txt";
  string ffm_file = kTestfilename + "_ffm.txt";
  string csv_file = kTestfilename + "_csv.txt";
  string lr_file_comma = kTestfilename + "_LR_comma.txt";
  string ffm_file_comma = kTestfilename + "_ffm_comma.txt";
  string csv_file_comma = kTestfilename + "_csv_comma.txt";
  // has no label
  string lr_no_file = kTestfilename + "_LR_no_comma.txt";
  string ffm_no_file = kTestfilename + "_ffm_no_comma.txt";
  string lr_no_file_comma = kTestfilename + "_LR_no_comma.txt";
  string ffm_no_file_comma = kTestfilename + "_ffm_no_comma.txt";
  // check
  read_from_memory(lr_file, 0);
  read_from_memory(ffm_file, 1);
  read_from_memory(csv_file, 2);
  read_from_memory(lr_no_file, 3);
  read_from_memory(ffm_no_file, 4);

  read_from_memory(lr_file_comma, 0);
  read_from_memory(ffm_file_comma, 1);
  read_from_memory(csv_file_comma, 2);
  read_from_memory(lr_no_file_comma, 3);
  read_from_memory(ffm_no_file_comma, 4);
}